

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResonanceParameters.test.cpp
# Opt level: O2

string * invalidSize_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             " 0.000000+0 0.000000+0          0          2         47          4262532151     \n-1.223300+6 1.000000+0 9.611086+5 2.000000+0 3.000000+0 4.000000+0262532151     \n 5.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0262532151     \n 1.000000+1 1.300000+1 1.400000+1 1.500000+1 1.600000+1 1.700000+1262532151     \n 1.800000+1 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0262532151     \n 7.788000+3 1.455000+0 1.187354+3 6.000000+0 7.000000+0 8.000000+0262532151     \n 9.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0262532151     \n 1.200000+1 1.900000+1 2.000000+1 2.100000+1 2.200000+1 2.300000+1262532151     \n 2.400000+1 0.000000+0 0.000000+0 0.000000+0 0.000000+0           262532151     \n"
             ,&local_9);
  return in_RDI;
}

Assistant:

std::string invalidSize() {
  return
    " 0.000000+0 0.000000+0          0          2         47          4262532151     \n"
    "-1.223300+6 1.000000+0 9.611086+5 2.000000+0 3.000000+0 4.000000+0262532151     \n"
    " 5.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0262532151     \n"
    " 1.000000+1 1.300000+1 1.400000+1 1.500000+1 1.600000+1 1.700000+1262532151     \n"
    " 1.800000+1 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0262532151     \n"
    " 7.788000+3 1.455000+0 1.187354+3 6.000000+0 7.000000+0 8.000000+0262532151     \n"
    " 9.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0 0.000000+0262532151     \n"
    " 1.200000+1 1.900000+1 2.000000+1 2.100000+1 2.200000+1 2.300000+1262532151     \n"
    " 2.400000+1 0.000000+0 0.000000+0 0.000000+0 0.000000+0           262532151     \n";
}